

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfect_hash_join_executor.cpp
# Opt level: O3

bool __thiscall
duckdb::PerfectHashJoinExecutor::TemplatedFillSelectionVectorBuild<duckdb::hugeint_t>
          (PerfectHashJoinExecutor *this,Vector *source,SelectionVector *sel_vec,
          SelectionVector *seq_sel_vec,idx_t count)

{
  _Head_base<0UL,_bool_*,_false> _Var1;
  bool bVar2;
  ulong uVar3;
  uint64_t uVar4;
  long lVar5;
  ulong uVar6;
  bool bVar7;
  hugeint_t input_value;
  hugeint_t min_value;
  hugeint_t max_value;
  UnifiedVectorFormat vector_data;
  hugeint_t local_c8;
  SelectionVector *local_b8;
  SelectionVector *local_b0;
  hugeint_t local_a8;
  hugeint_t local_98;
  hugeint_t local_88;
  UnifiedVectorFormat local_78;
  
  if (((this->perfect_join_statistics).build_min.is_null == false) &&
     ((this->perfect_join_statistics).build_max.is_null == false)) {
    local_b8 = seq_sel_vec;
    local_b0 = sel_vec;
    local_a8 = Value::GetValueUnsafe<duckdb::hugeint_t>(&(this->perfect_join_statistics).build_min);
    local_88 = Value::GetValueUnsafe<duckdb::hugeint_t>(&(this->perfect_join_statistics).build_max);
    UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
    Vector::ToUnifiedFormat(source,count,&local_78);
    if (count != 0) {
      bVar7 = false;
      lVar5 = 0;
      uVar6 = 0;
      do {
        uVar3 = uVar6;
        if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
          uVar3 = (ulong)(local_78.sel)->sel_vector[uVar6];
        }
        local_c8.lower = *(uint64_t *)(local_78.data + uVar3 * 0x10);
        local_c8.upper = *(uint64_t *)((long)(local_78.data + uVar3 * 0x10) + 8);
        bVar2 = hugeint_t::operator<=(&local_a8,&local_c8);
        if (bVar2) {
          bVar2 = hugeint_t::operator<=(&local_c8,&local_88);
          if (bVar2) {
            local_98 = hugeint_t::operator-(&local_c8,&local_a8);
            uVar4 = hugeint_t::operator_cast_to_unsigned_long(&local_98);
            local_b0->sel_vector[lVar5] = (sel_t)uVar4;
            _Var1._M_head_impl =
                 (this->bitmap_build_idx).super_unique_ptr<bool[],_std::default_delete<bool[]>_>.
                 _M_t.super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
                 super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
                 super__Head_base<0UL,_bool_*,_false>._M_head_impl;
            if (_Var1._M_head_impl[uVar4] != false) goto LAB_00bcfff0;
            _Var1._M_head_impl[uVar4] = true;
            this->unique_keys = this->unique_keys + 1;
            local_b8->sel_vector[lVar5] = (sel_t)uVar6;
            lVar5 = lVar5 + 1;
          }
        }
        uVar6 = uVar6 + 1;
        bVar7 = count <= uVar6;
      } while (uVar6 != count);
    }
    bVar7 = true;
LAB_00bcfff0:
    if (local_78.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
  else {
    bVar7 = false;
  }
  return bVar7;
}

Assistant:

bool PerfectHashJoinExecutor::TemplatedFillSelectionVectorBuild(Vector &source, SelectionVector &sel_vec,
                                                                SelectionVector &seq_sel_vec, idx_t count) {
	if (perfect_join_statistics.build_min.IsNull() || perfect_join_statistics.build_max.IsNull()) {
		return false;
	}
	auto min_value = perfect_join_statistics.build_min.GetValueUnsafe<T>();
	auto max_value = perfect_join_statistics.build_max.GetValueUnsafe<T>();
	UnifiedVectorFormat vector_data;
	source.ToUnifiedFormat(count, vector_data);
	auto data = reinterpret_cast<T *>(vector_data.data);
	// generate the selection vector
	for (idx_t i = 0, sel_idx = 0; i < count; ++i) {
		auto data_idx = vector_data.sel->get_index(i);
		auto input_value = data[data_idx];
		// add index to selection vector if value in the range
		if (min_value <= input_value && input_value <= max_value) {
			auto idx = (idx_t)(input_value - min_value); // subtract min value to get the idx position
			sel_vec.set_index(sel_idx, idx);
			if (bitmap_build_idx[idx]) {
				return false;
			} else {
				bitmap_build_idx[idx] = true;
				unique_keys++;
			}
			seq_sel_vec.set_index(sel_idx++, i);
		}
	}
	return true;
}